

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O0

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridSequence>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridSequence> *this,AccelerationContext *acc,istream *is)

{
  uint uVar1;
  istream *this_00;
  bool bVar2;
  int iVar3;
  TypeOneDRule TVar4;
  pointer pGVar5;
  int in_R8D;
  StorageSet local_e8;
  Data2D<double> local_c0;
  MultiIndexSet local_90;
  MultiIndexSet local_60;
  undefined1 local_21;
  istream *local_20;
  istream *is_local;
  AccelerationContext *acc_local;
  unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> *grid;
  
  local_21 = 0;
  local_20 = is;
  is_local = (istream *)acc;
  acc_local = (AccelerationContext *)this;
  Utils::make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,(AccelerationContext **)&is_local);
  iVar3 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
           operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                       *)this);
  (pGVar5->super_BaseCanonicalGrid).num_dimensions = iVar3;
  iVar3 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
           operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                       *)this);
  (pGVar5->super_BaseCanonicalGrid).num_outputs = iVar3;
  TVar4 = IO::readRule<TasGrid::IO::mode_binary_type>(local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
           operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                       *)this);
  pGVar5->rule = TVar4;
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_60,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar5->super_BaseCanonicalGrid).points,&local_60);
    MultiIndexSet::~MultiIndexSet(&local_60);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_90,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar5->super_BaseCanonicalGrid).needed,&local_90);
    MultiIndexSet::~MultiIndexSet(&local_90);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(local_20);
  this_00 = local_20;
  if (bVar2) {
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    uVar1 = (pGVar5->super_BaseCanonicalGrid).num_outputs;
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    iVar3 = MultiIndexSet::getNumIndexes(&(pGVar5->super_BaseCanonicalGrid).points);
    IO::readData2D<TasGrid::IO::mode_binary_type,double,int,int>
              (&local_c0,(IO *)this_00,(istream *)(ulong)uVar1,iVar3,in_R8D);
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    Data2D<double>::operator=(&pGVar5->surpluses,&local_c0);
    Data2D<double>::~Data2D(&local_c0);
  }
  pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
           operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                       *)this);
  if (0 < (pGVar5->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>(&local_e8,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
             operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                         *)this);
    StorageSet::operator=(&(pGVar5->super_BaseCanonicalGrid).values,&local_e8);
    StorageSet::~StorageSet(&local_e8);
  }
  pGVar5 = ::std::unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>::
           operator->((unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_>
                       *)this);
  GridSequence::prepareSequence(pGVar5,0);
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridSequence> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridSequence> grid = Utils::make_unique<GridSequence>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->rule = IO::readRule<iomode>(is);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        if (IO::readFlag<iomode>(is))
            grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        grid->prepareSequence(0);

        return grid;
    }